

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::AmrLevel::checkPoint(AmrLevel *this,string *dir,ostream *os,How how,bool dump_old)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string PathNameInHdr;
  string FullPath;
  string LevelDir;
  string FullPathName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = DescriptorList::size((DescriptorList *)desc_lst);
  LevelDir._M_dataplus._M_p = (pointer)&LevelDir.field_2;
  LevelDir._M_string_length = 0;
  LevelDir.field_2._M_local_buf[0] = '\0';
  FullPath._M_dataplus._M_p = (pointer)&FullPath.field_2;
  FullPath._M_string_length = 0;
  FullPath.field_2._M_local_buf[0] = '\0';
  LevelDirectoryNames(this,dir,&LevelDir,&FullPath);
  if (this->levelDirectoryCreated == false) {
    (*this->_vptr_AmrLevel[2])(this,dir);
    std::__cxx11::string::string
              ((string *)&PathNameInHdr,"AmrLevel::checkPoint::dir",(allocator *)&FullPathName);
    ParallelDescriptor::Barrier(&PathNameInHdr);
    std::__cxx11::string::~string((string *)&PathNameInHdr);
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar2 = (ostream *)std::ostream::operator<<(os,this->level);
    poVar2 = std::operator<<(poVar2,'\n');
    poVar2 = amrex::operator<<(poVar2,&this->geom);
    std::operator<<(poVar2,'\n');
    BoxArray::writeOn(&this->grids,os);
    poVar2 = (ostream *)std::ostream::operator<<(os,uVar1);
    std::operator<<(poVar2,'\n');
  }
  uVar3 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar3;
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    std::operator+(&FullPathName,&LevelDir,"/SD_");
    Concatenate(&PathNameInHdr,&FullPathName,(int)uVar4,1);
    std::__cxx11::string::~string((string *)&FullPathName);
    std::operator+(&local_50,&FullPath,"/SD_");
    Concatenate(&FullPathName,&local_50,(int)uVar4,1);
    std::__cxx11::string::~string((string *)&local_50);
    StateData::checkPoint
              ((StateData *)
               ((long)(((this->state).
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start)->domain).smallend.vect +
               uVar3 + -0x10),&PathNameInHdr,&FullPathName,os,how,dump_old);
    std::__cxx11::string::~string((string *)&FullPathName);
    std::__cxx11::string::~string((string *)&PathNameInHdr);
    uVar3 = uVar3 + 0xe0;
  }
  this->levelDirectoryCreated = false;
  std::__cxx11::string::~string((string *)&FullPath);
  std::__cxx11::string::~string((string *)&LevelDir);
  return;
}

Assistant:

void
AmrLevel::checkPoint (const std::string& dir,
                      std::ostream&      os,
                      VisMF::How         how,
                      bool               dump_old)
{
    BL_PROFILE("AmrLevel::checkPoint()");
    int ndesc = desc_lst.size(), i;
    //
    // Build directory to hold the MultiFabs in the StateData at this level.
    // The directory is relative the the directory containing the Header file.
    //
    std::string LevelDir, FullPath;
    LevelDirectoryNames(dir, LevelDir, FullPath);
    if( ! levelDirectoryCreated) {
      CreateLevelDirectory(dir);
      // ---- Force other processors to wait until directory is built.
      ParallelDescriptor::Barrier("AmrLevel::checkPoint::dir");
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << '\n' << geom  << '\n';
        grids.writeOn(os);
        os << ndesc << '\n';
    }
    //
    // Output state data.
    //

    for (i = 0; i < ndesc; i++)
    {
        //
        // Now build the full relative pathname of the StateData.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        std::string PathNameInHdr = amrex::Concatenate(LevelDir + "/SD_", i, 1);
        std::string FullPathName  = amrex::Concatenate(FullPath + "/SD_", i, 1);

        state[i].checkPoint(PathNameInHdr, FullPathName, os, how, dump_old);
    }

    levelDirectoryCreated = false;  // ---- now that the checkpoint is finished
}